

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O3

void collectDependencies(string *filename,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *lines)

{
  bool bVar1;
  pointer pbVar2;
  bool bVar3;
  long *plVar4;
  long lVar5;
  ostream *poVar6;
  size_type *psVar7;
  pointer pbVar8;
  string output;
  string cmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  raw_lines;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_90 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines;
  std::operator+(&local_d0,"otool -l \"",filename);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_b0.field_2._M_allocated_capacity = *psVar7;
    local_b0.field_2._8_8_ = plVar4[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar7;
    local_b0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_b0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  system_get_output(&local_d0,&local_b0);
  lVar5 = std::__cxx11::string::find((char *)&local_d0,0x11c3c0,0);
  if (((lVar5 == -1) &&
      (lVar5 = std::__cxx11::string::find((char *)&local_d0,0x11c3d0,0), lVar5 == -1)) &&
     (local_d0._M_string_length != 0)) {
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tokenize(&local_d0,"\n",&local_68);
    pbVar2 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = false;
      pbVar8 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        lVar5 = std::__cxx11::string::find((char *)pbVar8,0x11c409,0);
        if ((lVar5 == -1) &&
           (lVar5 = std::__cxx11::string::find((char *)pbVar8,0x11c41b,0), lVar5 == -1)) {
          bVar3 = bVar1;
          if ((bVar1) &&
             (lVar5 = std::__cxx11::string::find((char *)pbVar8,0x11c462,0), lVar5 != -1)) {
            std::__cxx11::string::substr((ulong)local_50,(ulong)pbVar8);
            plVar4 = (long *)std::__cxx11::string::insert((ulong)local_50,0,'\x01');
            psVar7 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_88.field_2._M_allocated_capacity = *psVar7;
              local_88.field_2._8_8_ = plVar4[3];
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            }
            else {
              local_88.field_2._M_allocated_capacity = *psVar7;
              local_88._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_88._M_string_length = plVar4[1];
            *plVar4 = (long)psVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_90,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
            bVar3 = false;
          }
        }
        else {
          bVar3 = true;
          if (bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"\n\n/!\\ ERROR: Failed to find name before next cmd",
                       0x30);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            goto LAB_00108f8e;
          }
        }
        bVar1 = bVar3;
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != pbVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Cannot find file ",0x11)
  ;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,filename->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," to read its dependencies",0x19);
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_00108f8e:
  exit(1);
}

Assistant:

void collectDependencies(const std::string& filename, std::vector<std::string>& lines)
{
    // execute "otool -l" on the given file and collect the command's output
    std::string cmd = "otool -l \"" + filename + "\"";
    std::string output = system_get_output(cmd);

    if(output.find("can't open file")!=std::string::npos or output.find("No such file")!=std::string::npos or output.size()<1)
    {
        std::cerr << "Cannot find file " << filename << " to read its dependencies" << std::endl;
        exit(1);
    }
    
    // split output
    std::vector<std::string> raw_lines;
    tokenize(output, "\n", &raw_lines);

    bool searching = false;
    for(const auto& line : raw_lines) {
        const auto &is_prefix = [&line](const char *const p) { return line.find(p) != std::string::npos; };
        if (is_prefix("cmd LC_LOAD_DYLIB") || is_prefix("cmd LC_REEXPORT_DYLIB"))
        {
            if (searching)
            {
                std::cerr << "\n\n/!\\ ERROR: Failed to find name before next cmd" << std::endl;
                exit(1);
            }
            searching = true;
        }
        else if (searching)
        {
            size_t found = line.find("name ");
            if (found != std::string::npos)
            {
                lines.push_back('\t' + line.substr(found+5, std::string::npos));
                searching = false;
            }
        }
    }
}